

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall
Minisat::IntOption::getNonDefaultString(IntOption *this,int granularity,char *buffer,size_t size)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  pointer piVar7;
  pointer piVar8;
  uint uVar9;
  vector<int,_std::allocator<int>_> values;
  vector<int,_std::allocator<int>_> local_48;
  
  if (granularity == 0) {
    uVar9 = (this->range).begin;
    uVar4 = (this->range).end;
    if ((uVar4 - uVar9) - 2 < 0xf && (int)uVar9 <= (int)uVar4) {
      do {
        if (uVar9 != this->defaultValue) {
          snprintf(buffer,size,"%d",(ulong)uVar9);
          sVar3 = strlen(buffer);
          size = ~sVar3 + size;
          uVar1 = (this->range).end;
          uVar4 = uVar9;
          if ((uVar9 != uVar1) && (uVar4 = uVar1, uVar9 + 1 != this->defaultValue)) {
            buffer[(int)sVar3] = ',';
            lVar6 = (long)((sVar3 << 0x20) + 0x100000000) >> 0x20;
            buffer[lVar6] = '\0';
            buffer = buffer + lVar6;
            uVar4 = (this->range).end;
          }
        }
        bVar2 = (int)uVar9 < (int)uVar4;
        uVar9 = uVar9 + 1;
      } while (bVar2);
    }
  }
  else {
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    fillGranularityDomain(this,granularity,&local_48);
    piVar8 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      uVar5 = 0;
      piVar7 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (piVar8[uVar5] != this->defaultValue) {
          snprintf(buffer,size,"%d");
          sVar3 = strlen(buffer);
          size = size + ~sVar3;
          piVar7 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar8 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((uVar5 + 1 <
               (ulong)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2)) &&
             (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar5 + 1] != this->defaultValue)) {
            buffer[(int)sVar3] = ',';
            lVar6 = (long)((sVar3 << 0x20) + 0x100000000) >> 0x20;
            buffer[lVar6] = '\0';
            buffer = buffer + lVar6;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)piVar7 - (long)piVar8 >> 2));
    }
    if (piVar8 != (pointer)0x0) {
      operator_delete(piVar8);
    }
  }
  return;
}

Assistant:

virtual void getNonDefaultString(int granularity, char *buffer, size_t size)
    {
        if (granularity != 0) {
            std::vector<int> values;
            fillGranularityDomain(granularity, values);
            for (size_t i = 0; i < values.size(); ++i) {
                if (values[i] == defaultValue) {
                    continue;
                }                                        // do not print default value
                snprintf(buffer, size, "%d", values[i]); // convert value
                const int sl = strlen(buffer);
                size = size - strlen(buffer) - 1; // store new size
                if (i + 1 < values.size() && values[i + 1] != defaultValue) {
                    buffer[sl] = ',';           // set separator
                    buffer[sl + 1] = 0;         // indicate end of buffer
                    buffer = &(buffer[sl + 1]); // move start pointer accordingly (len is one more now)
                }
            }
        } else if (range.end - range.begin <= 16 && range.end - range.begin > 1) {
            for (int i = range.begin; i <= range.end; ++i) {
                if (i == defaultValue) {
                    continue;
                }                                // do not print default value
                snprintf(buffer, size, "%d", i); // convert value
                const int sl = strlen(buffer);
                size = size - strlen(buffer) - 1; // store new size
                if (i != range.end && i + 1 != defaultValue) {
                    buffer[sl] = ',';           // set separator
                    buffer[sl + 1] = 0;         // indicate end of buffer
                    buffer = &(buffer[sl + 1]); // move start pointer accordingly (len is one more now)
                }
            }
        }
    }